

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O1

string * __thiscall
HighsIis::iisBoundStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,HighsIis *this,HighsInt bound_status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(bound_status) {
  case 0:
    pcVar2 = "   Null";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "   Free";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "  Lower";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "  Upper";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "  Boxed";
    pcVar1 = "";
    break;
  case -1:
    pcVar2 = "Dropped";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "*****";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string HighsIis::iisBoundStatusToString(HighsInt bound_status) const {
  if (bound_status == kIisBoundStatusDropped) return "Dropped";
  if (bound_status == kIisBoundStatusNull) return "   Null";
  if (bound_status == kIisBoundStatusFree) return "   Free";
  if (bound_status == kIisBoundStatusLower) return "  Lower";
  if (bound_status == kIisBoundStatusUpper) return "  Upper";
  if (bound_status == kIisBoundStatusBoxed) return "  Boxed";
  return "*****";
}